

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildService
          (DescriptorBuilder *this,ServiceDescriptorProto *proto,void *param_2,
          ServiceDescriptor *result,FlatAllocator *alloc)

{
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_00;
  FlatAllocator *descriptor;
  void *pvVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  PointerT<google::protobuf::FieldOptions> pFVar5;
  MethodDescriptorProto *proto_00;
  Symbol local_b8;
  string_view local_b0;
  string_view local_a0;
  string_view local_90;
  int local_7c;
  undefined1 auStack_78 [4];
  int i;
  string_view local_68;
  string_view local_58;
  string_view local_48;
  char *local_38;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *local_30;
  FlatAllocator *alloc_local;
  ServiceDescriptor *result_local;
  void *param_2_local;
  ServiceDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  local_30 = &alloc->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ;
  alloc_local = (FlatAllocator *)result;
  result_local = (ServiceDescriptor *)param_2;
  param_2_local = proto;
  proto_local = (ServiceDescriptorProto *)this;
  local_48 = FileDescriptor::package(this->file_);
  psVar4 = ServiceDescriptorProto::name_abi_cxx11_((ServiceDescriptorProto *)param_2_local);
  local_58 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4)
  ;
  local_38 = (char *)AllocateNameStrings(this,local_48,local_58,(Message *)param_2_local,
                                         (FlatAllocator *)local_30);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.
  super_Base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.value
       = (PointerT<std::__cxx11::basic_string<char>_>)local_38;
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::SourceCodeInfo>.value =
       (PointerT<google::protobuf::SourceCodeInfo>)this->file_;
  psVar4 = ServiceDescriptorProto::name_abi_cxx11_((ServiceDescriptorProto *)param_2_local);
  local_68 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4)
  ;
  _auStack_78 = ServiceDescriptor::full_name((ServiceDescriptor *)alloc_local);
  ValidateSymbolName(this,local_68,_auStack_78,(Message *)param_2_local);
  iVar2 = ServiceDescriptorProto::method_size((ServiceDescriptorProto *)param_2_local);
  this_00 = local_30;
  *(int *)&(alloc_local->
           super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ).pointers_.payload_.super_Base<google::protobuf::EnumOptions>.value = iVar2;
  iVar2 = ServiceDescriptorProto::method_size((ServiceDescriptorProto *)param_2_local);
  pFVar5 = (PointerT<google::protobuf::FieldOptions>)
           anon_unknown_24::
           FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
           ::AllocateArray<google::protobuf::MethodDescriptor>(this_00,iVar2);
  (alloc_local->
  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ).pointers_.payload_.super_Base<google::protobuf::FieldOptions>.value = pFVar5;
  local_7c = 0;
  while( true ) {
    iVar2 = local_7c;
    iVar3 = ServiceDescriptorProto::method_size((ServiceDescriptorProto *)param_2_local);
    pvVar1 = param_2_local;
    descriptor = alloc_local;
    if (iVar3 <= iVar2) break;
    proto_00 = ServiceDescriptorProto::method((ServiceDescriptorProto *)param_2_local,local_7c);
    BuildMethod(this,proto_00,(ServiceDescriptor *)alloc_local,
                (MethodDescriptor *)
                (&((alloc_local->
                   super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                   ).pointers_.payload_.super_Base<google::protobuf::FieldOptions>.value)->
                  super_Message + (long)local_7c * 5),(FlatAllocator *)local_30);
    local_7c = local_7c + 1;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,"google.protobuf.ServiceOptions");
  AllocateOptions<google::protobuf::ServiceDescriptor>
            (this,(Proto *)pvVar1,(ServiceDescriptor *)descriptor,3,local_90,
             (FlatAllocator *)local_30);
  local_a0 = ServiceDescriptor::full_name((ServiceDescriptor *)alloc_local);
  local_b0 = ServiceDescriptor::name((ServiceDescriptor *)alloc_local);
  pvVar1 = param_2_local;
  Symbol::Symbol(&local_b8,(ServiceDescriptor *)alloc_local);
  AddSymbol(this,local_a0,(void *)0x0,local_b0,(Message *)pvVar1,local_b8);
  return;
}

Assistant:

void DescriptorBuilder::BuildService(const ServiceDescriptorProto& proto,
                                     const void* /* dummy */,
                                     ServiceDescriptor* result,
                                     internal::FlatAllocator& alloc) {
  result->all_names_ =
      AllocateNameStrings(file_->package(), proto.name(), proto, alloc);
  result->file_ = file_;
  ValidateSymbolName(proto.name(), result->full_name(), proto);

  BUILD_ARRAY(proto, result, method, BuildMethod, result);

  // Copy options.
  AllocateOptions(proto, result, ServiceDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.ServiceOptions", alloc);

  AddSymbol(result->full_name(), nullptr, result->name(), proto,
            Symbol(result));
}